

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskTable.cpp
# Opt level: O0

void __thiscall DiskTableNode::loadIndexFilter(DiskTableNode *this)

{
  size_t n;
  bool bVar1;
  SSTableIndex *pSVar2;
  map<long_long,_unsigned_long,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_unsigned_long>_>_>
  *pmVar3;
  SSTableHeader *pSVar4;
  BloomFilter<long_long> *this_00;
  pair<const_long_long,_unsigned_long> local_70;
  reference local_60;
  SSTableIndexItem *item;
  iterator __end2;
  iterator __begin2;
  SSTableIndex *__range2;
  size_t count;
  undefined1 local_28 [8];
  SSTableIndex ssindex;
  DiskTableNode *this_local;
  
  if ((this->index == (IndexMap *)0x0) && (this->filter == (Filter *)0x0)) {
    ssindex.super__Vector_base<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)this;
    pSVar2 = SSTable::getIndex(this->_sstable);
    std::vector<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>::vector
              ((vector<SSTableIndexItem,_std::allocator<SSTableIndexItem>_> *)local_28,pSVar2);
    pmVar3 = (map<long_long,_unsigned_long,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_unsigned_long>_>_>
              *)operator_new(0x30);
    (pmVar3->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    (pmVar3->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
    (pmVar3->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (pmVar3->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    *(undefined8 *)&(pmVar3->_M_t)._M_impl = 0;
    *(undefined8 *)&(pmVar3->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
    std::
    map<long_long,_unsigned_long,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_unsigned_long>_>_>
    ::map(pmVar3);
    this->index = pmVar3;
    pSVar4 = getHeader(this);
    n = pSVar4->entries_count;
    this_00 = (BloomFilter<long_long> *)operator_new(0x60);
    BloomFilter<long_long>::BloomFilter(this_00,n * 10,n,0,4);
    this->filter = this_00;
    __end2 = std::vector<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>::begin
                       ((vector<SSTableIndexItem,_std::allocator<SSTableIndexItem>_> *)local_28);
    item = (SSTableIndexItem *)
           std::vector<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>::end
                     ((vector<SSTableIndexItem,_std::allocator<SSTableIndexItem>_> *)local_28);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<SSTableIndexItem_*,_std::vector<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>_>
                                  *)&item);
      if (!bVar1) break;
      local_60 = __gnu_cxx::
                 __normal_iterator<SSTableIndexItem_*,_std::vector<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>_>
                 ::operator*(&__end2);
      pmVar3 = this->index;
      std::pair<const_long_long,_unsigned_long>::pair<const_long_long,_unsigned_long,_true>
                (&local_70,&local_60->key,&local_60->offset);
      std::
      map<long_long,_unsigned_long,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_unsigned_long>_>_>
      ::insert(pmVar3,&local_70);
      BloomFilter<long_long>::add(this->filter,&local_60->key);
      __gnu_cxx::
      __normal_iterator<SSTableIndexItem_*,_std::vector<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>_>
      ::operator++(&__end2);
    }
    std::vector<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>::~vector
              ((vector<SSTableIndexItem,_std::allocator<SSTableIndexItem>_> *)local_28);
  }
  return;
}

Assistant:

void DiskTableNode::loadIndexFilter() {
    if (index == nullptr && filter == nullptr) {
        // Info from _sstable->index is used to generate filter and index, dont need after that.
        auto ssindex = SSTableIndex{std::move(*_sstable->getIndex())};
        index = new IndexMap{};
        auto count = getHeader()->entries_count;
        filter = new Filter{10 * count, count, 0};
        for (const auto &item:ssindex) {
            index->insert({item.key, item.offset});
            filter->add(item.key);
        }
    }
}